

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexMatch.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::RegexMatch::match(RegexMatch *this,shared_ptr<const_oout::Text> *in)

{
  element_type *peVar1;
  ostream *poVar2;
  __shared_ptr_access<const_oout::Text,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  string local_228 [32];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_208;
  undefined1 local_1e1 [17];
  undefined1 local_1d0 [32];
  ostringstream message;
  undefined1 local_40 [8];
  string origin;
  shared_ptr<const_oout::Text> *in_local;
  RegexMatch *this_local;
  
  peVar1 = std::__shared_ptr_access<const_oout::Text,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  (*peVar1->_vptr_Text[2])(local_40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 0x18));
  poVar2 = std::operator<<((ostream *)(local_1d0 + 0x18),"\'");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,"\' match with \'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(in->
                                   super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_refcount);
  std::operator<<(poVar2,"\'");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(in->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             0x10);
  local_1e1[0] = (_Alloc_hider)
                 std::
                 regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,&local_208,0);
  std::__cxx11::ostringstream::str();
  std::make_shared<oout::CondResult,bool,std::__cxx11::string>
            ((bool *)(local_1e1 + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e1);
  std::make_unique<oout::TestResult,std::shared_ptr<oout::CondResult>>
            ((shared_ptr<oout::CondResult> *)local_1d0);
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::TestResult,std::default_delete<oout::TestResult>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,
             (unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::shared_ptr<oout::CondResult>::~shared_ptr((shared_ptr<oout::CondResult> *)(local_1e1 + 1));
  std::__cxx11::string::~string(local_228);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 0x18));
  std::__cxx11::string::~string((string *)local_40);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> RegexMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' match with '" << re << "'";

	return make_unique<TestResult>(
		make_shared<CondResult>(regex_search(origin, regex(re)), message.str())
	);
}